

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O2

void __thiscall
f8n::runtime::MessageQueue::Enqueue(MessageQueue *this,IMessagePtr *message,int64_t delayMs)

{
  _List_node_base *p_Var1;
  long lVar2;
  EnqueuedMessage *this_00;
  long lVar3;
  _Self __tmp;
  const_iterator __position;
  EnqueuedMessage *m;
  
  lVar3 = 0;
  if (0 < delayMs) {
    lVar3 = delayMs;
  }
  lVar2 = std::chrono::_V2::system_clock::now();
  this_00 = (EnqueuedMessage *)operator_new(0x18);
  (this_00->message).super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_00->message).super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this_00->time).__r = 0;
  m = this_00;
  std::__shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2> *)this_00,
             &message->super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>);
  lVar3 = lVar2 / 1000000 + lVar3;
  (this_00->time).__r = lVar3;
  p_Var1 = (this->queue).
           super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  __position._M_node = p_Var1;
  while ((__position._M_node != (_List_node_base *)&this->queue &&
         ((long)__position._M_node[1]._M_next[1]._M_next <= lVar3))) {
    __position._M_node = (__position._M_node)->_M_next;
  }
  std::__cxx11::
  list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
  ::insert(&this->queue,__position,&m);
  if ((this->queue).
      super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
      ._M_impl._M_node._M_size != 0) {
    LOCK();
    (this->nextMessageTime).super___atomic_base<long>._M_i =
         (__int_type)
         (this->queue).
         super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
         ._M_impl._M_node.super__List_node_base._M_next[1]._M_next[1]._M_next;
    UNLOCK();
  }
  if (__position._M_node == p_Var1) {
    std::_V2::condition_variable_any::notify_all(&this->waitForDispatch);
  }
  return;
}

Assistant:

void MessageQueue::Enqueue(IMessagePtr message, int64_t delayMs) {
    delayMs = std::max((int64_t) 0, delayMs);

    milliseconds now = duration_cast<milliseconds>(
        system_clock::now().time_since_epoch());

    EnqueuedMessage *m = new EnqueuedMessage();
    m->message = message;
    m->time = now + milliseconds(delayMs);

    /* the queue is time ordered. start from the front of the queue, and
    work our way back until we find the correct place to insert the new one */

    typedef std::list<EnqueuedMessage*>::iterator Iterator;
    Iterator curr = this->queue.begin();

    while (curr != this->queue.end()) {
        if ((*curr)->time <= m->time) {
            curr++;
        }
        else {
            break;
        }
    }

    bool first = (curr == this->queue.begin());

    this->queue.insert(curr, m);

    if (this->queue.size()) {
        this->nextMessageTime.store((*this->queue.begin())->time.count());
    }

    if (first) {
        this->waitForDispatch.notify_all();
    }
}